

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt)

{
  bool bVar1;
  undefined1 local_1d0 [8];
  ostringstream msg;
  undefined1 local_58 [8];
  cmListFileBacktrace backtrace;
  cmListFileBacktrace *bt_local;
  string *text_local;
  MessageType t_local;
  cmake *this_local;
  
  backtrace.Snapshot.Position.Position = (PositionType)bt;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_58,bt);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  bVar1 = PrintMessagePreamble(this,t,(ostream *)local_1d0);
  if (bVar1) {
    cmListFileBacktrace::PrintTitle((cmListFileBacktrace *)local_58,(ostream *)local_1d0);
    printMessageText((ostream *)local_1d0,text);
    cmListFileBacktrace::PrintCallStack((cmListFileBacktrace *)local_58,(ostream *)local_1d0);
    displayMessage(t,(ostringstream *)local_1d0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_58);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt)
{
  cmListFileBacktrace backtrace = bt;

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}